

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O1

uint64_t expmod(uint64_t b,uint64_t x,uint64_t n)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint64_t uVar6;
  
  if (x == 0) {
    uVar6 = 1;
  }
  else {
    uVar6 = 1;
    do {
      if ((x & 1) != 0) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar6;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = b;
        uVar6 = __umodti3(SUB168(auVar2 * auVar4,0),SUB168(auVar2 * auVar4,8),n,0);
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = b;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = b;
      b = __umodti3(SUB168(auVar3 * auVar5,0),SUB168(auVar3 * auVar5,8),n,0);
      bVar1 = 1 < x;
      x = x >> 1;
    } while (bVar1);
  }
  return uVar6;
}

Assistant:

uint64_t expmod(uint64_t b, uint64_t x, uint64_t n) {
    // perform an efficient exponentiation by squaring
    uint64_t res = 1;
    while(x > 0) {
        if(x & 0x0000000000000001) {
            res = mulmod(res, b, n);
        }
        b = mulmod(b, b, n);
        x >>= 1;
    }
    return res;
}